

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall OpenMD::GenericData::~GenericData(GenericData *this)

{
  void *in_RDI;
  
  ~GenericData((GenericData *)0x1bd358);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~GenericData() {}